

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cc
# Opt level: O1

bool flow::lang::TokenTraits::isRelOp(Token t)

{
  return t - Equal < 9;
}

Assistant:

bool TokenTraits::isRelOp(Token t) {
  switch (t) {
    case Token::Equal:
    case Token::UnEqual:
    case Token::Less:
    case Token::Greater:
    case Token::LessOrEqual:
    case Token::GreaterOrEqual:
    case Token::PrefixMatch:
    case Token::SuffixMatch:
    case Token::RegexMatch:
      return true;
    default:
      return false;
  }
}